

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bezier.h
# Opt level: O3

void __thiscall
bezier::BinomialCoefficients<5UL>::BinomialCoefficients(BinomialCoefficients<5UL> *this)

{
  unsigned_long *puVar1;
  long lVar2;
  
  (this->mCoefficients)._M_elems[0] = 0;
  (this->mCoefficients)._M_elems[1] = 0;
  (this->mCoefficients)._M_elems[2] = 0;
  (this->mCoefficients)._M_elems[3] = 0;
  (this->mCoefficients)._M_elems[4] = 0;
  (this->mCoefficients)._M_elems[5] = 0;
  puVar1 = (this->mCoefficients)._M_elems + 2;
  (this->mCoefficients)._M_elems[0] = 1;
  (this->mCoefficients)._M_elems[1] = 5;
  (this->mCoefficients)._M_elems[2] = 10;
  lVar2 = 0;
  do {
    (this->mCoefficients)._M_elems[lVar2 + 3] = *puVar1;
    lVar2 = lVar2 + 1;
    puVar1 = puVar1 + -1;
  } while (lVar2 != 3);
  return;
}

Assistant:

BinomialCoefficients()
        {
            size_t center = N / 2;
            size_t k = 0;

            while (k <= center)
            {
                mCoefficients[k] = internal::binomial(N, k);
                k++;
            }

            // Utilize the symmetrical nature of the binomial coefficients.
            while (k <= N)
            {
                mCoefficients[k] = mCoefficients[N - k];
                k++;
            }
        }